

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

string * genId_abi_cxx11_(void)

{
  pointer pcVar1;
  uint __val;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  string *in_RDI;
  uint __len;
  string __str;
  string newid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  size_type local_40;
  long local_38 [2];
  
  gmlc::utilities::randomString_abi_cxx11_(0x2e40a4);
  *(undefined1 *)local_48 = 0x2d;
  *(undefined1 *)((long)local_48 + 6) = 0x2d;
  *(undefined1 *)((long)local_48 + 0xc) = 0x2d;
  *(undefined1 *)((long)local_48 + 0x12) = 0x2d;
  uVar4 = getpid();
  __val = -uVar4;
  if (0 < (int)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_002e411d;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_002e411d;
      }
      if (uVar6 < 10000) goto LAB_002e411d;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_002e411d:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_68,(ulong)(__len + -((int)uVar4 >> 0x1f)),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_68._M_dataplus._M_p + (uint)-((int)uVar4 >> 0x1f),__len,__val);
  pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_68,(char *)local_48,local_40);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar1 = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar7) {
    uVar2 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar1;
    (in_RDI->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return in_RDI;
}

Assistant:

static inline std::string genId()
{
    std::string newid = gmlc::utilities::randomString(24);

    newid[0] = '-';
    newid[6] = '-';
    newid[12] = '-';
    newid[18] = '-';

#ifdef _WIN32
    std::string pid_str = std::to_string(GetCurrentProcessId()) + newid;
#else
    std::string pid_str = std::to_string(getpid()) + newid;
#endif
    return pid_str;
}